

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::ScrollIndicator::drawIndicator(ScrollIndicator *this,QPainter *p,QColor *c)

{
  int x1;
  int x2;
  int y1;
  int y2;
  QPen aQStack_48 [8];
  QBrush local_40 [8];
  QColor paintColor;
  
  if (this->policy != ScrollIndicatorAlwaysOff) {
    paintColor._0_8_ = *(undefined8 *)c;
    paintColor._8_8_ = *(undefined8 *)((long)&c->ct + 4);
    if ((this->policy != ScrollIndicatorAlwaysOn) && (this->animate != false)) {
      QColor::setAlpha((int)&paintColor);
    }
    QBrush::QBrush(local_40,&paintColor,SolidPattern);
    QPen::QPen(SUB84((double)this->width,0),aQStack_48,local_40,1,0x20,0x40);
    QPainter::setPen((QPen *)p);
    QPen::~QPen(aQStack_48);
    QBrush::~QBrush(local_40);
    x1 = this->width / 2;
    if (this->orientation == Horizontal) {
      y2 = x1;
      x2 = this->size;
      y1 = x1;
      x1 = 0;
    }
    else {
      y1 = 0;
      y2 = this->size;
      x2 = x1;
    }
    QPainter::drawLine(p,x1,y1,x2,y2);
  }
  return;
}

Assistant:

void
ScrollIndicator::drawIndicator( QPainter * p, const QColor & c )
{
	if( policy != AbstractScrollArea::ScrollIndicatorAlwaysOff )
	{
		QColor paintColor = c;

		if( animate && policy != AbstractScrollArea::ScrollIndicatorAlwaysOn )
			paintColor.setAlpha( alpha );

		p->setPen( QPen( paintColor, width, Qt::SolidLine, Qt::RoundCap ) );

		const int middle = width / 2;

		if( orientation == Qt::Horizontal )
			p->drawLine( 0, middle, size, middle );
		else
			p->drawLine( middle, 0, middle, size );
	}
}